

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskBaseCase::postDraw(SampleMaskBaseCase *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_runMode == RUN_PER_TWO_SAMPLES) {
    (**(code **)(lVar2 + 0x4e8))(0x8c36);
    (**(code **)(lVar2 + 0xdc8))(0x3f800000);
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"disable sample shading",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x457);
    return;
  }
  return;
}

Assistant:

void SampleMaskBaseCase::postDraw (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_runMode == RUN_PER_TWO_SAMPLES)
	{
		gl.disable(GL_SAMPLE_SHADING);
		gl.minSampleShading(1.0f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "disable sample shading");
	}
}